

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

void Io_WriteHie(Abc_Ntk_t *pNtk,char *pBaseName,char *pFileName)

{
  int iVar1;
  Io_FileType_t IVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  int local_3c;
  Abc_Ntk_t *pAStack_38;
  int i;
  Abc_Ntk_t *pNtkBase;
  Abc_Ntk_t *pNtkResult;
  Abc_Ntk_t *pNtkTemp;
  char *pFileName_local;
  char *pBaseName_local;
  Abc_Ntk_t *pNtk_local;
  
  pAStack_38 = (Abc_Ntk_t *)0x0;
  if (pNtk == (Abc_Ntk_t *)0x0) {
    fprintf(_stdout,"Empty network.\n");
  }
  else {
    iVar1 = Abc_NtkIsStrash(pNtk);
    if ((iVar1 == 0) && (iVar1 = Abc_NtkIsLogic(pNtk), iVar1 == 0)) {
      __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                    ,0x1ef,"void Io_WriteHie(Abc_Ntk_t *, char *, char *)");
    }
    IVar2 = Io_ReadFileType(pBaseName);
    if (IVar2 == IO_FILE_BLIF) {
      pAStack_38 = Io_ReadBlifMv(pBaseName,0,1);
    }
    else {
      IVar2 = Io_ReadFileType(pBaseName);
      if (IVar2 == IO_FILE_BLIFMV) {
        pAStack_38 = Io_ReadBlifMv(pBaseName,1,1);
      }
      else {
        IVar2 = Io_ReadFileType(pBaseName);
        if (IVar2 == IO_FILE_VERILOG) {
          pAStack_38 = Io_ReadVerilog(pBaseName,1);
        }
        else {
          fprintf(_stderr,"Unknown input file format.\n");
        }
      }
    }
    if (pAStack_38 != (Abc_Ntk_t *)0x0) {
      iVar1 = Abc_NtkWhiteboxNum(pAStack_38);
      if ((0 < iVar1) && (pNtk->nBarBufs == 0)) {
        pAVar4 = Abc_NtkFlattenLogicHierarchy(pAStack_38);
        Abc_NtkDelete(pAStack_38);
        pAStack_38 = pAVar4;
        if (pAVar4 == (Abc_Ntk_t *)0x0) {
          return;
        }
      }
      if (pNtk->nBarBufs < 1) {
        IVar2 = Io_ReadFileType(pBaseName);
        if (IVar2 == IO_FILE_BLIFMV) {
          iVar1 = Abc_NtkBlackboxNum(pAStack_38);
          if (0 < iVar1) {
            printf("Hierarchy writer does not support BLIF-MV with blackboxes.\n");
            Abc_NtkDelete(pAStack_38);
            return;
          }
          iVar1 = Abc_NtkIsNetlist(pNtk);
          if (iVar1 != 0) {
            __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                          ,0x217,"void Io_WriteHie(Abc_Ntk_t *, char *, char *)");
          }
          pAVar4 = Abc_NtkToNetlist(pNtk);
          iVar1 = Abc_NtkConvertToBlifMv(pAVar4);
          if (iVar1 == 0) {
            Abc_NtkDelete(pAStack_38);
            return;
          }
          pNtkBase = Abc_NtkInsertBlifMv(pAStack_38,pAVar4);
          Abc_NtkDelete(pAVar4);
        }
        else {
          iVar1 = Abc_NtkBlackboxNum(pAStack_38);
          if (iVar1 < 1) {
            printf("Warning: The output network does not contain blackboxes.\n");
            pNtkBase = Abc_NtkToNetlist(pNtk);
          }
          else {
            pAVar4 = Abc_NtkToNetlist(pNtk);
            pNtkBase = Abc_NtkInsertNewLogic(pAStack_38,pAVar4);
            Abc_NtkDelete(pAVar4);
            if (pNtkBase != (Abc_Ntk_t *)0x0) {
              uVar3 = Abc_NtkBlackboxNum(pAStack_38);
              printf("Hierarchy writer reintroduced %d instances of blackboxes.\n",(ulong)uVar3);
            }
          }
        }
      }
      else {
        pAVar4 = Abc_NtkToNetlist(pNtk);
        pNtkBase = Abc_NtkFromBarBufs(pAStack_38,pAVar4);
        Abc_NtkDelete(pAVar4);
        if (pNtkBase != (Abc_Ntk_t *)0x0) {
          printf("Hierarchy writer replaced %d barbufs by hierarchy boundaries.\n",
                 (ulong)(uint)pNtk->nBarBufs);
        }
      }
      Abc_NtkDelete(pAStack_38);
      if (pNtkBase != (Abc_Ntk_t *)0x0) {
        IVar2 = Io_ReadFileType(pFileName);
        if (IVar2 == IO_FILE_BLIF) {
          if (pNtkBase->pDesign == (Abc_Des_t *)0x0) {
            iVar1 = Abc_NtkHasSop(pNtkBase);
            if ((iVar1 == 0) && (iVar1 = Abc_NtkHasMapping(pNtkBase), iVar1 == 0)) {
              Abc_NtkToSop(pNtkBase,-1,1000000000);
            }
          }
          else {
            for (local_3c = 0; iVar1 = Vec_PtrSize(pNtkBase->pDesign->vModules), local_3c < iVar1;
                local_3c = local_3c + 1) {
              pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(pNtkBase->pDesign->vModules,local_3c);
              iVar1 = Abc_NtkHasSop(pAVar4);
              if ((iVar1 == 0) && (iVar1 = Abc_NtkHasMapping(pAVar4), iVar1 == 0)) {
                Abc_NtkToSop(pAVar4,-1,1000000000);
              }
            }
          }
          Io_WriteBlif(pNtkBase,pFileName,1,0,0);
        }
        else {
          IVar2 = Io_ReadFileType(pFileName);
          if (IVar2 == IO_FILE_VERILOG) {
            if (pNtkBase->pDesign == (Abc_Des_t *)0x0) {
              iVar1 = Abc_NtkHasAig(pNtkBase);
              if ((iVar1 == 0) && (iVar1 = Abc_NtkHasMapping(pNtkBase), iVar1 == 0)) {
                Abc_NtkToAig(pNtkBase);
              }
            }
            else {
              for (local_3c = 0; iVar1 = Vec_PtrSize(pNtkBase->pDesign->vModules), local_3c < iVar1;
                  local_3c = local_3c + 1) {
                pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(pNtkBase->pDesign->vModules,local_3c);
                iVar1 = Abc_NtkHasAig(pAVar4);
                if ((iVar1 == 0) && (iVar1 = Abc_NtkHasMapping(pAVar4), iVar1 == 0)) {
                  Abc_NtkToAig(pAVar4);
                }
              }
            }
            Io_WriteVerilog(pNtkBase,pFileName,0);
          }
          else {
            IVar2 = Io_ReadFileType(pFileName);
            if (IVar2 == IO_FILE_BLIFMV) {
              Io_WriteBlifMv(pNtkBase,pFileName);
            }
            else {
              fprintf(_stderr,"Unknown output file format.\n");
            }
          }
        }
        Abc_NtkDelete(pNtkBase);
      }
    }
  }
  return;
}

Assistant:

void Io_WriteHie( Abc_Ntk_t * pNtk, char * pBaseName, char * pFileName )
{
    Abc_Ntk_t * pNtkTemp, * pNtkResult, * pNtkBase = NULL;
    int i;
    // check if the current network is available
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Empty network.\n" );
        return;
    }

    // read the base network
    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );
    if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIF )
        pNtkBase = Io_ReadBlifMv( pBaseName, 0, 1 );
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIFMV )
        pNtkBase = Io_ReadBlifMv( pBaseName, 1, 1 );
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_VERILOG )
        pNtkBase = Io_ReadVerilog( pBaseName, 1 );
    else 
        fprintf( stderr, "Unknown input file format.\n" );
    if ( pNtkBase == NULL )
        return;

    // flatten logic hierarchy if present
    if ( Abc_NtkWhiteboxNum(pNtkBase) > 0 && pNtk->nBarBufs == 0 )
    {
        pNtkBase = Abc_NtkFlattenLogicHierarchy( pNtkTemp = pNtkBase );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkBase == NULL )
            return;
    }

    // reintroduce the boxes into the netlist
    if ( pNtk->nBarBufs > 0 )
    {
        // derive the netlist
        pNtkResult = Abc_NtkToNetlist( pNtk );
        pNtkResult = Abc_NtkFromBarBufs( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkResult )
            printf( "Hierarchy writer replaced %d barbufs by hierarchy boundaries.\n", pNtk->nBarBufs );
    }
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIFMV ) 
    {
        if ( Abc_NtkBlackboxNum(pNtkBase) > 0 )
        {
            printf( "Hierarchy writer does not support BLIF-MV with blackboxes.\n" );
            Abc_NtkDelete( pNtkBase );
            return;
        }
        // convert the current network to BLIF-MV
        assert( !Abc_NtkIsNetlist(pNtk) );
        pNtkResult = Abc_NtkToNetlist( pNtk );
        if ( !Abc_NtkConvertToBlifMv( pNtkResult ) )
        {
            Abc_NtkDelete( pNtkBase );
            return;
        }
        // reintroduce the network
        pNtkResult = Abc_NtkInsertBlifMv( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
    }
    else if ( Abc_NtkBlackboxNum(pNtkBase) > 0 )
    {
        // derive the netlist
        pNtkResult = Abc_NtkToNetlist( pNtk );
        pNtkResult = Abc_NtkInsertNewLogic( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkResult )
            printf( "Hierarchy writer reintroduced %d instances of blackboxes.\n", Abc_NtkBlackboxNum(pNtkBase) );
    }
    else
    {
        printf( "Warning: The output network does not contain blackboxes.\n" );
        pNtkResult = Abc_NtkToNetlist( pNtk );
    }
    Abc_NtkDelete( pNtkBase );
    if ( pNtkResult == NULL )
        return;

    // write the resulting network
    if ( Io_ReadFileType(pFileName) == IO_FILE_BLIF )
    {
        if ( pNtkResult->pDesign )
        {
            Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkResult->pDesign->vModules, pNtkTemp, i )
                if ( !Abc_NtkHasSop(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
                    Abc_NtkToSop( pNtkTemp, -1, ABC_INFINITY );
        }
        else
        {
            if ( !Abc_NtkHasSop(pNtkResult) && !Abc_NtkHasMapping(pNtkResult) )
                Abc_NtkToSop( pNtkResult, -1, ABC_INFINITY );
        }
        Io_WriteBlif( pNtkResult, pFileName, 1, 0, 0 );
    }
    else if ( Io_ReadFileType(pFileName) == IO_FILE_VERILOG )
    {
        if ( pNtkResult->pDesign )
        {
            Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkResult->pDesign->vModules, pNtkTemp, i )
                if ( !Abc_NtkHasAig(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
                    Abc_NtkToAig( pNtkTemp );
        }
        else
        {
            if ( !Abc_NtkHasAig(pNtkResult) && !Abc_NtkHasMapping(pNtkResult) )
                Abc_NtkToAig( pNtkResult );
        }
        Io_WriteVerilog( pNtkResult, pFileName, 0 );
    }
    else if ( Io_ReadFileType(pFileName) == IO_FILE_BLIFMV )
    {
        Io_WriteBlifMv( pNtkResult, pFileName );
    }
    else 
        fprintf( stderr, "Unknown output file format.\n" );

    Abc_NtkDelete( pNtkResult );
}